

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O0

aom_codec_err_t parse_decoder_model_info(aom_read_bit_buffer *rb,int *buffer_delay_length_minus_1)

{
  int iVar1;
  uint32_t bits;
  aom_read_bit_buffer *in_RSI;
  uint8_t frame_presentation_time_length_minus_1;
  uint8_t buffer_removal_time_length_minus_1;
  uint32_t num_units_in_decoding_tick;
  int in_stack_ffffffffffffffec;
  
  iVar1 = aom_rb_read_literal(in_RSI,in_stack_ffffffffffffffec);
  *(int *)&in_RSI->bit_buffer = iVar1;
  bits = aom_rb_read_unsigned_literal(in_RSI,in_stack_ffffffffffffffec);
  aom_rb_read_literal(in_RSI,bits);
  aom_rb_read_literal(in_RSI,bits);
  return AOM_CODEC_OK;
}

Assistant:

static int parse_decoder_model_info(struct aom_read_bit_buffer *reader) {
  int result = 0;
  AV1C_PUSH_ERROR_HANDLER_DATA(result);

  AV1C_READ_BITS_OR_RETURN_ERROR(buffer_delay_length_minus_1, 5);
  AV1C_READ_BITS_OR_RETURN_ERROR(num_units_in_decoding_tick, 32);
  AV1C_READ_BITS_OR_RETURN_ERROR(buffer_removal_time_length_minus_1, 5);
  AV1C_READ_BITS_OR_RETURN_ERROR(frame_presentation_time_length_minus_1, 5);

  AV1C_POP_ERROR_HANDLER_DATA();
  return buffer_delay_length_minus_1 + 1;
}